

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O3

gc_heap_ptr<mjs::gc_vector<mjs::object::property>::gc_table> __thiscall
mjs::gc_vector<mjs::object::property>::gc_table::copy_with_increased_capacity
          (gc_table *this,uint32_t new_capacity)

{
  void *pvVar1;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  gc_heap_ptr<mjs::gc_vector<mjs::object::property>::gc_table> gVar3;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,new_capacity);
  if (in_EDX < *(uint *)((long)puVar2 + 0xc)) {
    __assert_fail("new_capacity >= length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                  ,0x6a,
                  "gc_heap_ptr<gc_table> mjs::gc_vector<mjs::object::property>::gc_table::copy_with_increased_capacity(uint32_t) const [T = mjs::object::property]"
                 );
  }
  make<>(this,(gc_heap *)*puVar2,in_EDX);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  if (*(uint *)((long)puVar2 + 0xc) <= *(uint *)((long)pvVar1 + 8)) {
    *(uint *)((long)pvVar1 + 0xc) = *(uint *)((long)puVar2 + 0xc);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    memcpy((void *)((long)pvVar1 + 0x10),puVar2 + 2,(ulong)*(uint *)((long)puVar2 + 0xc) << 4);
    gVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (gc_heap_ptr<mjs::gc_vector<mjs::object::property>::gc_table>)
           gVar3.super_gc_heap_ptr_untyped;
  }
  __assert_fail("new_length <= capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x73,
                "void mjs::gc_vector<mjs::object::property>::gc_table::length(uint32_t) [T = mjs::object::property]"
               );
}

Assistant:

[[nodiscard]] gc_heap_ptr<gc_table> copy_with_increased_capacity(uint32_t new_capacity) const {
            assert(new_capacity >= length());
            auto nt = make(heap(), new_capacity);
            nt->length(length());
            // Since it's the same heap the representation can just be copied
            std::memcpy(nt->entries(), entries(), length() * sizeof(T));
            return nt;
        }